

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O3

SPIRFunction * __thiscall
spirv_cross::Compiler::
set<spirv_cross::SPIRFunction,spirv_cross::TypedID<(spirv_cross::Types)1>&,spirv_cross::TypedID<(spirv_cross::Types)1>&>
          (Compiler *this,uint32_t id,TypedID<(spirv_cross::Types)1> *args,
          TypedID<(spirv_cross::Types)1> *args_1)

{
  Variant *this_00;
  SPIRFunction *val;
  
  ParsedIR::add_typed_id(&this->ir,TypeFunction,(ID)id);
  this_00 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id;
  val = ObjectPool<spirv_cross::SPIRFunction>::
        allocate<spirv_cross::TypedID<(spirv_cross::Types)1>&,spirv_cross::TypedID<(spirv_cross::Types)1>&>
                  ((ObjectPool<spirv_cross::SPIRFunction> *)
                   this_00->group->pools[4]._M_t.
                   super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,args,
                   args_1);
  Variant::set(this_00,&val->super_IVariant,TypeFunction);
  (val->super_IVariant).self.id = id;
  return val;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}